

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

matrix sptk::swipe::copym(matrix yr_matrix)

{
  long in_RSI;
  undefined8 in_RDI;
  matrix mVar1;
  int i;
  matrix nw_matrix;
  int local_24;
  double **local_8;
  
  mVar1 = makem((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  for (local_24 = 0; local_24 < (int)in_RDI; local_24 = local_24 + 1) {
    local_8 = mVar1.m;
    memcpy(local_8[local_24],*(void **)(in_RSI + (long)local_24 * 8),
           (long)(int)((ulong)in_RDI >> 0x20) << 3);
  }
  return mVar1;
}

Assistant:

matrix copym(matrix yr_matrix) {
    matrix nw_matrix = makem(yr_matrix.x, yr_matrix.y);
    int i;
    for (i = 0; i < yr_matrix.x; i++) // does not assume contiguity
        memcpy(nw_matrix.m[i], yr_matrix.m[i],
               sizeof(double) * yr_matrix.y);
    return(nw_matrix);
}